

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynShortFunctionDefinition * ParseShortFunctionDefinition(ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  SynIdentifier *this;
  undefined4 extraout_var_00;
  SynShortFunctionArgument *node;
  SynBase *pSVar4;
  undefined4 extraout_var_02;
  Lexeme *pLVar5;
  char *pcVar6;
  Lexeme *begin;
  IntrusiveList<SynShortFunctionArgument> arguments;
  IntrusiveList<SynBase> local_88;
  IntrusiveList<SynShortFunctionArgument> local_78;
  Lexeme *local_60;
  SynShortFunctionArgument *local_58;
  SynShortFunctionArgument *pSStack_50;
  SynBase *local_48;
  SynBase *pSStack_40;
  SynShortFunctionDefinition *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  local_60 = ctx->currentLexeme;
  if (local_60->type == lex_less) {
    begin = local_60 + 1;
    ctx->currentLexeme = begin;
    local_78.head = (SynShortFunctionArgument *)0x0;
    local_78.tail = (SynShortFunctionArgument *)0x0;
    if (local_60[1].type != lex_greater) {
      while( true ) {
        pSVar4 = ParseType(ctx,(bool *)0x0,false);
        if (ctx->currentLexeme->type != lex_string) {
          ctx->currentLexeme = begin;
          pSVar4 = (SynBase *)0x0;
        }
        if (local_78.head == (SynShortFunctionArgument *)0x0) {
          pcVar6 = "ERROR: function argument name not found after \'<\'";
        }
        else {
          pcVar6 = "ERROR: function argument name not found after \',\'";
        }
        bVar2 = anon_unknown.dwarf_169315::CheckAt(ctx,lex_string,pcVar6);
        if (bVar2) {
          pLVar5 = ctx->currentLexeme;
          pcVar6 = pLVar5->pos;
          uVar1 = pLVar5->length;
          if (pLVar5->type != lex_none) {
            ctx->currentLexeme = pLVar5 + 1;
          }
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021847f;
          pLVar5 = ctx->currentLexeme + -1;
          SynBase::SynBase((SynBase *)this,4,pLVar5,pLVar5);
          (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
          (this->name).begin = pcVar6;
          (this->name).end = pcVar6 + uVar1;
        }
        else {
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021847f;
          begin = ctx->currentLexeme + -1;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar3);
          (this->super_SynBase).typeID = 4;
          (this->super_SynBase).begin = (Lexeme *)0x0;
          (this->super_SynBase).end = (Lexeme *)0x0;
          (this->super_SynBase).pos.begin = (char *)0x0;
          (this->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(this->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(this->super_SynBase).next + 2) = 0;
          (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
          (this->name).begin = (char *)0x0;
          (this->name).end = (char *)0x0;
        }
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        node = (SynShortFunctionArgument *)CONCAT44(extraout_var_01,iVar3);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021847f;
        SynBase::SynBase((SynBase *)node,0x38,begin,ctx->currentLexeme + -1);
        (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e8140;
        node->type = pSVar4;
        node->name = this;
        IntrusiveList<SynShortFunctionArgument>::push_back(&local_78,node);
        if (ctx->currentLexeme->type != lex_comma) break;
        begin = ctx->currentLexeme + 1;
        ctx->currentLexeme = begin;
      }
    }
    anon_unknown.dwarf_169315::CheckConsume
              (ctx,lex_greater,"ERROR: \'>\' expected after short inline function argument list");
    local_88 = (IntrusiveList<SynBase>)ZEXT816(0);
    if (ctx->currentLexeme->type == lex_ofigure) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      local_88 = ParseExpressions(ctx);
      anon_unknown.dwarf_169315::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after function body");
    }
    else {
      pSVar4 = ParseStatement(ctx);
      if ((pSVar4 == (SynBase *)0x0) && (pSVar4 = ParseAssignment(ctx), pSVar4 == (SynBase *)0x0)) {
        anon_unknown.dwarf_169315::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after function header");
      }
      else {
        IntrusiveList<SynBase>::push_back(&local_88,pSVar4);
      }
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this_00 = (SynShortFunctionDefinition *)CONCAT44(extraout_var_02,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_0021847f:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    local_48 = local_88.head;
    pSStack_40 = local_88.tail;
    local_58 = local_78.head;
    pSStack_50 = local_78.tail;
    SynBase::SynBase((SynBase *)this_00,0x39,local_60,ctx->currentLexeme + -1);
    (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e8178;
    (this_00->arguments).head = local_58;
    (this_00->arguments).tail = pSStack_50;
    (this_00->expressions).head = local_48;
    (this_00->expressions).tail = pSStack_40;
  }
  else {
    this_00 = (SynShortFunctionDefinition *)0x0;
  }
  return this_00;
}

Assistant:

SynShortFunctionDefinition* ParseShortFunctionDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_less))
	{
		IntrusiveList<SynShortFunctionArgument> arguments;

		bool isFirst = true;

		do
		{
			if(isFirst && ctx.At(lex_greater))
				break;

			isFirst = false;

			Lexeme *pos = ctx.currentLexeme;

			Lexeme *lexeme = ctx.currentLexeme;

			SynBase *type = ParseType(ctx);

			if(!ctx.At(lex_string))
			{
				// Backtrack
				ctx.currentLexeme = lexeme;

				type = NULL;
			}

			bool hasName = false;

			if(arguments.empty())
				hasName = CheckAt(ctx, lex_string, "ERROR: function argument name not found after '<'");
			else
				hasName = CheckAt(ctx, lex_string, "ERROR: function argument name not found after ','");

			SynIdentifier *nameIdentifier = NULL;

			if(hasName)
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				pos = ctx.Previous();

				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
			}

			arguments.push_back(new (ctx.get<SynShortFunctionArgument>()) SynShortFunctionArgument(pos, ctx.Previous(), type, nameIdentifier));
		}
		while(ctx.Consume(lex_comma));

		CheckConsume(ctx, lex_greater, "ERROR: '>' expected after short inline function argument list");

		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_ofigure))
		{
			expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after function body");
		}
		else if(SynBase *body = ParseStatement(ctx))
		{
			expressions.push_back(body);
		}
		else if(SynBase *body = ParseAssignment(ctx))
		{
			expressions.push_back(body);
		}
		else
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after function header");
		}

		return new (ctx.get<SynShortFunctionDefinition>()) SynShortFunctionDefinition(start, ctx.Previous(), arguments, expressions);
	}

	return NULL;
}